

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O0

void ST::apply_format<char_const(&)[2]>(format_writer *data,char (*arg0) [2])

{
  bool bVar1;
  out_of_range *this;
  char *in_RDX;
  function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *local_b0;
  long local_90;
  size_t formatter_id;
  format_spec spec;
  size_t index;
  undefined1 local_38 [8];
  formatter_ref_t formatters [1];
  char (*arg0_local) [2];
  format_writer *data_local;
  
  formatters[0]._M_invoker = (_Invoker_type)arg0;
  make_formatter_ref<char_const*>((formatter_ref_t *)local_38,(ST *)arg0,in_RDX);
  spec.float_class = float_default;
  spec.pad = '\0';
  spec.always_signed = false;
  spec.class_prefix = false;
  spec.numeric_pad = false;
  while( true ) {
    bVar1 = format_writer::next_format(data);
    if (!bVar1) {
      local_b0 = (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)
                 &formatters[0]._M_invoker;
      do {
        local_b0 = local_b0 + -1;
        std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::~function(local_b0);
      } while (local_b0 != (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)local_38
              );
      return;
    }
    format_writer::parse_format((format_spec *)((long)&formatter_id + 4),data);
    if (spec.minimum_length < 0) {
      local_90._0_4_ = spec.float_class;
      local_90._4_1_ = spec.pad;
      local_90._5_1_ = spec.always_signed;
      local_90._6_1_ = spec.class_prefix;
      local_90._7_1_ = spec.numeric_pad;
      spec._20_8_ = spec._20_8_ + 1;
    }
    else {
      local_90 = (long)(spec.minimum_length + -1);
    }
    if (local_90 != 0) break;
    std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::operator()
              ((function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)local_38,
               (format_spec *)((long)&formatter_id + 4),data);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }